

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_26::TapAssertionPrinter::printOriginalExpression(TapAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  string local_30;
  TapAssertionPrinter *local_10;
  TapAssertionPrinter *this_local;
  
  local_10 = this;
  bVar1 = AssertionResult::hasExpression(this->result);
  if (bVar1) {
    poVar2 = std::operator<<(this->stream,' ');
    AssertionResult::getExpression_abi_cxx11_(&local_30,this->result);
    std::operator<<(poVar2,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void printOriginalExpression() const {
                if (result.hasExpression()) {
                    stream << ' ' << result.getExpression();
                }
            }